

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestSuite::Skip(TestSuite *this)

{
  int iVar1;
  UnitTest *pUVar2;
  TestEventListeners *this_00;
  TestEventListener *pTVar3;
  TestInfo *this_01;
  int local_1c;
  int i;
  TestEventListener *repeater;
  TestSuite *this_local;
  
  if ((this->should_run_ & 1U) != 0) {
    pUVar2 = UnitTest::GetInstance();
    UnitTest::set_current_test_suite(pUVar2,this);
    pUVar2 = UnitTest::GetInstance();
    this_00 = UnitTest::listeners(pUVar2);
    pTVar3 = TestEventListeners::repeater(this_00);
    (*pTVar3->_vptr_TestEventListener[6])(pTVar3,this);
    (*pTVar3->_vptr_TestEventListener[7])(pTVar3,this);
    for (local_1c = 0; iVar1 = total_test_count(this), local_1c < iVar1; local_1c = local_1c + 1) {
      this_01 = GetMutableTestInfo(this,local_1c);
      TestInfo::Skip(this_01);
    }
    (*pTVar3->_vptr_TestEventListener[0xc])(pTVar3,this);
    (*pTVar3->_vptr_TestEventListener[0xd])(pTVar3,this);
    pUVar2 = UnitTest::GetInstance();
    UnitTest::set_current_test_suite(pUVar2,(TestSuite *)0x0);
  }
  return;
}

Assistant:

void TestSuite::Skip() {
  if (!should_run_) return;

  UnitTest::GetInstance()->set_current_test_suite(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Call both legacy and the new API
  repeater->OnTestSuiteStart(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseStart(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  for (int i = 0; i < total_test_count(); i++) {
    GetMutableTestInfo(i)->Skip();
  }

  // Call both legacy and the new API
  repeater->OnTestSuiteEnd(*this);
  // Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseEnd(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  UnitTest::GetInstance()->set_current_test_suite(nullptr);
}